

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Printer::Outdent(Printer *this)

{
  ulong uVar1;
  ulong uVar2;
  bool in_DL;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  PrintOptions opts;
  undefined8 local_28;
  char *local_20;
  
  uVar1 = this->indent_;
  uVar2 = (this->options_).spaces_per_indent;
  local_28 = 0x23;
  local_20 = "Outdent() without matching Indent()";
  message.invoker_ =
       absl::lts_20240722::functional_internal::
       InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
  ;
  message.ptr_.obj = &local_28;
  opts.use_annotation_frames = in_DL;
  opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)0x0;
  opts.checks_are_debug_only = true;
  opts.use_substitution_map = false;
  opts.use_curly_brace_substitutions = false;
  opts.allow_digit_substitutions = true;
  opts.strip_spaces_around_vars = true;
  opts.strip_raw_string_indentation = false;
  Validate(uVar2 <= uVar1,opts,message);
  if (uVar2 <= uVar1) {
    this->indent_ = this->indent_ - (this->options_).spaces_per_indent;
  }
  return;
}

Assistant:

void Printer::Outdent() {
  PrintOptions opts;
  opts.checks_are_debug_only = true;
  if (!Validate(indent_ >= options_.spaces_per_indent, opts,
                "Outdent() without matching Indent()")) {
    return;
  }
  indent_ -= options_.spaces_per_indent;
}